

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall JsonObject_KeyIsNotString_Test::TestBody(JsonObject_KeyIsNotString_Test *this)

{
  bool bVar1;
  parser<pstore::json::null_output> *this_00;
  error_code *lhs;
  char *pcVar2;
  error_code eVar3;
  AssertHelper local_140;
  Message local_138;
  coord local_130;
  coord local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  error_code local_100;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_a8 [8];
  parser<pstore::json::null_output> p;
  JsonObject_KeyIsNotString_Test *this_local;
  
  p.coordinate_ = (coord)this;
  pstore::json::parser<pstore::json::null_output>::parser
            ((parser<pstore::json::null_output> *)local_a8,0);
  s_abi_cxx11_(&local_d0,"{{}:{}}",7);
  this_00 = pstore::json::parser<pstore::json::null_output>::input
                      ((parser<pstore::json::null_output> *)local_a8,&local_d0);
  pstore::json::parser<pstore::json::null_output>::eof(this_00);
  std::__cxx11::string::~string((string *)&local_d0);
  lhs = pstore::json::parser<pstore::json::null_output>::last_error
                  ((parser<pstore::json::null_output> *)local_a8);
  eVar3 = pstore::json::make_error_code(expected_string);
  local_100._M_cat = eVar3._M_cat;
  local_100._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_f0,"p.last_error ()",
             "make_error_code (json::error_code::expected_string)",lhs,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_128 = pstore::json::parser<pstore::json::null_output>::coordinate
                        ((parser<pstore::json::null_output> *)local_a8);
  pstore::json::coord::coord(&local_130,2,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_120,"p.coordinate ()","(json::coord{2U, 1U})",&local_128,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pstore::json::parser<pstore::json::null_output>::~parser
            ((parser<pstore::json::null_output> *)local_a8);
  return;
}

Assistant:

TEST_F (JsonObject, KeyIsNotString) {
    json::parser<json::null_output> p;
    p.input ("{{}:{}}"s).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_string));
    EXPECT_EQ (p.coordinate (), (json::coord{2U, 1U}));
}